

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_mergable.cpp
# Opt level: O1

ostream * cpp_client::operator<<(ostream *out,Delta_mergable *obj)

{
  _Hash_node_base *p_Var1;
  undefined8 in_RAX;
  ostream *poVar2;
  _Hash_node_base *p_Var3;
  undefined8 uStack_38;
  
  p_Var3 = (obj->variables_->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    uStack_38 = in_RAX;
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)p_Var3[1]._M_nxt,(long)p_Var3[2]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      p_Var1 = p_Var3[5]._M_nxt;
      if (p_Var1 == (_Hash_node_base *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[empty]",7);
      }
      else {
        (*(code *)p_Var1->_M_nxt[7]._M_nxt)(p_Var1,poVar2);
      }
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Delta_mergable& obj)
{
   for(const auto& var : obj.variables_)
   {
      out << var.first << ": " << var.second << '\n';
   }
   return out;
}